

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int is_whole_packet_present(stb_vorbis *f)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8 *puVar4;
  bool bVar5;
  STBVorbisError SVar6;
  uint8 *puVar7;
  int iVar8;
  long lVar9;
  uint8 *puVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar2 = f->next_seg;
  lVar9 = (long)iVar2;
  puVar7 = f->stream;
  SVar6 = VORBIS_need_more_data;
  bVar5 = lVar9 != -1;
  if (lVar9 == -1) {
    bVar12 = true;
  }
  else {
    iVar3 = f->segment_count;
    iVar8 = iVar3;
    if (iVar3 < iVar2) {
      iVar8 = iVar2;
    }
    for (; lVar9 < iVar3; lVar9 = lVar9 + 1) {
      puVar7 = puVar7 + f->segments[lVar9];
      if ((ulong)f->segments[lVar9] != 0xff) {
        iVar8 = (int)lVar9;
        break;
      }
    }
    if (f->stream_end < puVar7) goto LAB_001749e8;
    bVar12 = iVar8 == -1 || iVar8 == iVar3;
  }
  do {
    if (!bVar12) {
      return 1;
    }
    puVar4 = f->stream_end;
    if (puVar4 <= puVar7 + 0x1a) break;
    if ((*(uint8 (*) [4])puVar7 != ogg_page_header) || ((char)*(int *)(puVar7 + 4) != '\0')) {
LAB_001749e6:
      SVar6 = VORBIS_invalid_stream;
      break;
    }
    if (bVar5) {
      if ((puVar7[5] & 1) == 0) goto LAB_001749e6;
    }
    else if ((f->previous_length != 0) && ((puVar7[5] & 1) != 0)) goto LAB_001749e6;
    bVar1 = puVar7[0x1a];
    puVar10 = puVar7 + (ulong)bVar1 + 0x1b;
    if (puVar4 < puVar10) break;
    for (uVar11 = 0; (uint)bVar1 != uVar11; uVar11 = uVar11 + 1) {
      puVar10 = puVar10 + puVar7[uVar11 + 0x1b];
      if ((ulong)puVar7[uVar11 + 0x1b] != 0xff) goto LAB_001749ce;
    }
    uVar11 = (ulong)(uint)bVar1;
LAB_001749ce:
    puVar7 = puVar10;
    bVar12 = (uint)uVar11 == (uint)bVar1;
    bVar5 = true;
  } while (puVar7 <= puVar4);
LAB_001749e8:
  f->error = SVar6;
  return 0;
}

Assistant:

static int is_whole_packet_present(stb_vorbis *f)
{
   // make sure that we have the packet available before continuing...
   // this requires a full ogg parse, but we know we can fetch from f->stream

   // instead of coding this out explicitly, we could save the current read state,
   // read the next packet with get8() until end-of-packet, check f->eof, then
   // reset the state? but that would be slower, esp. since we'd have over 256 bytes
   // of state to restore (primarily the page segment table)

   int s = f->next_seg, first = TRUE;
   uint8 *p = f->stream;

   if (s != -1) { // if we're not starting the packet with a 'continue on next page' flag
      for (; s < f->segment_count; ++s) {
         p += f->segments[s];
         if (f->segments[s] < 255)               // stop at first short segment
            break;
      }
      // either this continues, or it ends it...
      if (s == f->segment_count)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   for (; s == -1;) {
      uint8 *q;
      int n;

      // check that we have the page header ready
      if (p + 26 >= f->stream_end)               return error(f, VORBIS_need_more_data);
      // validate the page
      if (memcmp(p, ogg_page_header, 4))         return error(f, VORBIS_invalid_stream);
      if (p[4] != 0)                             return error(f, VORBIS_invalid_stream);
      if (first) { // the first segment must NOT have 'continued_packet', later ones MUST
         if (f->previous_length)
            if ((p[5] & PAGEFLAG_continued_packet))  return error(f, VORBIS_invalid_stream);
         // if no previous length, we're resynching, so we can come in on a continued-packet,
         // which we'll just drop
      } else {
         if (!(p[5] & PAGEFLAG_continued_packet)) return error(f, VORBIS_invalid_stream);
      }
      n = p[26]; // segment counts
      q = p+27;  // q points to segment table
      p = q + n; // advance past header
      // make sure we've read the segment table
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      for (s=0; s < n; ++s) {
         p += q[s];
         if (q[s] < 255)
            break;
      }
      if (s == n)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   return TRUE;
}